

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

Instr * __thiscall LowererMD::LoadStackArgPtr(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  IndirOpnd *pIVar6;
  Instr *pIVar7;
  Func *pFVar8;
  StackSym *sym;
  
  bVar2 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  if (!bVar2) {
    pIVar7 = LowererMDArch::LoadStackArgPtr(&this->lowererMDArch,instr);
    return pIVar7;
  }
  pFVar8 = this->m_func;
  sym = pFVar8->m_loopParamSym;
  if (sym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x23e,"(this->m_func->GetLoopParamSym())","this->m_func->GetLoopParamSym()")
    ;
    if (!bVar2) goto LAB_006502a4;
    *puVar4 = 0;
    pFVar8 = this->m_func;
    sym = pFVar8->m_loopParamSym;
  }
  pRVar5 = IR::RegOpnd::New(sym,TyInt64,pFVar8);
  pIVar6 = IR::IndirOpnd::New(pRVar5,0x20,TyInt64,this->m_func,false);
  pRVar5 = IR::RegOpnd::New(TyInt64,this->m_func);
  pIVar7 = IR::Instr::New(MOV,&pRVar5->super_Opnd,&pIVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar7);
  pIVar6 = IR::IndirOpnd::New(pRVar5,8,TyInt64,this->m_func,false);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_006502a4;
    *puVar4 = 0;
  }
  pFVar8 = instr->m_func;
  if ((pIVar6->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_006502a4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = (pIVar6->super_Opnd).field_0xb;
  if ((bVar3 & 2) != 0) {
    pIVar6 = (IndirOpnd *)IR::Opnd::Copy(&pIVar6->super_Opnd,pFVar8);
    bVar3 = (pIVar6->super_Opnd).field_0xb;
  }
  (pIVar6->super_Opnd).field_0xb = bVar3 | 2;
  instr->m_src1 = &pIVar6->super_Opnd;
  instr->m_opcode = LEA;
  return instr->m_prev;
}

Assistant:

IR::Instr *
LowererMD::LoadStackArgPtr(IR::Instr * instr)
{
    if (this->m_func->IsLoopBody())
    {
        // Get the first user param from the interpreter frame instance that was passed in.
        // These args don't include the func object and callinfo; we just need to advance past "this".

        // t1 = MOV [prm1 + m_inParams]
        // dst = LEA &[t1 + sizeof(var)]

        Assert(this->m_func->GetLoopParamSym());
        IR::RegOpnd *baseOpnd = IR::RegOpnd::New(this->m_func->GetLoopParamSym(), TyMachReg, this->m_func);
        size_t offset = Js::InterpreterStackFrame::GetOffsetOfInParams();
        IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(baseOpnd, (int32)offset, TyMachReg, this->m_func);
        IR::RegOpnd *tmpOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
        IR::Instr *instrLdParams = IR::Instr::New(Js::OpCode::MOV, tmpOpnd, indirOpnd, this->m_func);
        instr->InsertBefore(instrLdParams);

        indirOpnd = IR::IndirOpnd::New(tmpOpnd, sizeof(Js::Var), TyMachReg, this->m_func);
        instr->SetSrc1(indirOpnd);
        instr->m_opcode = Js::OpCode::LEA;

        return instr->m_prev;
    }
    else
    {
        return this->lowererMDArch.LoadStackArgPtr(instr);
    }
}